

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadSemaphorePosix.cpp
# Opt level: O2

int __thiscall IlmThread_2_5::Semaphore::value(Semaphore *this)

{
  int iVar1;
  int value;
  allocator<char> local_2d;
  int local_2c;
  string local_28 [32];
  
  iVar1 = sem_getvalue((sem_t *)&this->_semaphore,&local_2c);
  if (iVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_28,"Cannot read semaphore value (%T).",&local_2d);
    Iex_2_5::throwErrnoExc(local_28);
    std::__cxx11::string::~string(local_28);
  }
  return local_2c;
}

Assistant:

int
Semaphore::value () const
{
    int value;

    if (::sem_getvalue (&_semaphore, &value))
        IEX_NAMESPACE::throwErrnoExc ("Cannot read semaphore value (%T).");

    return value;
}